

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cxx
# Opt level: O2

void __thiscall trento::Output::Output(Output *this,VarMap *var_map)

{
  pointer *ppfVar1;
  undefined1 auVar2 [16];
  function<void_(int,_double,_int,_const_trento::Event_&)> *pfVar3;
  bool bVar4;
  any *paVar5;
  int *piVar6;
  bool *pbVar7;
  long lVar8;
  function<void_(int,_double,_int,_const_trento::Event_&)> *pfVar9;
  size_type sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  runtime_error *prVar11;
  size_type sVar12;
  pointer pfVar13;
  function<void_(int,_double,_int,_const_trento::Event_&)> *pfVar14;
  function<void_(int,_double,_int,_const_trento::Event_&)> *pfVar15;
  anon_class_40_3_2e487188 *__args;
  anon_class_40_3_2e487188 *__args_00;
  int iVar16;
  __type _Var17;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  key_type local_80;
  int local_60;
  byte local_5c;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 auVar18 [16];
  
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_80,"number-events",(allocator *)&local_50);
  paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar6 = boost::any_cast<int_const&>(paVar5);
  iVar16 = *piVar6;
  std::__cxx11::string::~string((string *)&local_80);
  _Var17 = std::log10<int>(iVar16);
  std::__cxx11::string::string((string *)&local_80,"quiet",(allocator *)&local_50);
  paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  auVar18._8_8_ = extraout_XMM1_Qb;
  auVar18._0_8_ = extraout_XMM1_Qa;
  pbVar7 = boost::any_cast<bool_const&>(paVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = _Var17;
  auVar2 = vroundsd_avx(auVar18,auVar2,10);
  bVar4 = *pbVar7;
  iVar16 = (int)auVar2._0_8_;
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar4 == false) {
    pfVar15 = (this->writers_).
              super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pfVar15 ==
        (this->writers_).
        super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar12 = std::
               vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      local_58 = (this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pfVar3 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar13 = std::
                _Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                ::_M_allocate((_Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                               *)this,sVar12);
      lVar8 = (long)pfVar15 - (long)pfVar3;
      *(undefined8 *)((long)pfVar13 + lVar8) = 0;
      ((undefined8 *)((long)pfVar13 + lVar8))[1] = 0;
      *(int *)((long)pfVar13 + lVar8) = iVar16;
      *(code **)((long)pfVar13 + lVar8 + 0x18) =
           std::
           _Function_handler<void_(int,_double,_int,_const_trento::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/output.cxx:176:7)>
           ::_M_invoke;
      *(code **)((long)pfVar13 + lVar8 + 0x10) =
           std::
           _Function_handler<void_(int,_double,_int,_const_trento::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/output.cxx:176:7)>
           ::_M_manager;
      pfVar9 = std::
               __relocate_a_1<std::function<void(int,double,int,trento::Event_const&)>*,std::function<void(int,double,int,trento::Event_const&)>*,std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>
                         (pfVar3,pfVar15,pfVar13,
                          (allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>
                           *)this);
      pfVar15 = std::
                __relocate_a_1<std::function<void(int,double,int,trento::Event_const&)>*,std::function<void(int,double,int,trento::Event_const&)>*,std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>
                          (pfVar15,local_58,pfVar9 + 1,
                           (allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>
                            *)this);
      if (pfVar3 != (function<void_(int,_double,_int,_const_trento::Event_&)> *)0x0) {
        operator_delete(pfVar3);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar13;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar15;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar13 + sVar12;
    }
    else {
      *(undefined8 *)&(pfVar15->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(pfVar15->super__Function_base)._M_functor + 8) = 0;
      *(int *)&(pfVar15->super__Function_base)._M_functor = iVar16;
      pfVar15->_M_invoker =
           std::
           _Function_handler<void_(int,_double,_int,_const_trento::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/output.cxx:176:7)>
           ::_M_invoke;
      (pfVar15->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(int,_double,_int,_const_trento::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/output.cxx:176:7)>
           ::_M_manager;
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
  }
  std::__cxx11::string::string((string *)&local_80,"output",(allocator *)&local_50);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)(var_map + 0x10),&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar10 != 0) {
    std::__cxx11::string::string((string *)&local_80,"output",(allocator *)&local_50);
    paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
    __rhs = &boost::any_cast<boost::filesystem::path_const&>(paVar5)->m_pathname;
    std::__cxx11::string::~string((string *)&local_80);
    bVar4 = hdf5::filename_is_hdf5((path *)__rhs);
    if (bVar4) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"HDF5 output was not compiled");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar4 = boost::filesystem::exists((path *)__rhs);
    if (bVar4) {
      bVar4 = boost::filesystem::is_empty((path *)__rhs);
      if (!bVar4) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"output directory \'",__rhs);
        std::operator+(&local_80,&local_50,"\' must be empty");
        std::runtime_error::runtime_error(prVar11,(string *)&local_80);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      boost::filesystem::create_directories((path *)__rhs);
    }
    std::__cxx11::string::string((string *)&local_80,"no-header",(allocator *)&local_50);
    paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
    pbVar7 = boost::any_cast<bool_const&>(paVar5);
    bVar4 = *pbVar7;
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_80,(string *)__rhs);
    local_5c = bVar4 ^ 1;
    pfVar15 = (this->writers_).
              super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_60 = iVar16;
    if (pfVar15 ==
        (this->writers_).
        super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar12 = std::
               vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      pfVar3 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar9 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar13 = std::
                _Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                ::_M_allocate((_Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                               *)this,sVar12);
      std::
      allocator_traits<std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>::
      construct<std::function<void(int,double,int,trento::Event_const&)>,trento::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)(((long)pfVar15 - (long)pfVar9) + (long)pfVar13),
                 (function<void_(int,_double,_int,_const_trento::Event_&)> *)&local_80,__args_00);
      pfVar14 = std::
                __relocate_a_1<std::function<void(int,double,int,trento::Event_const&)>*,std::function<void(int,double,int,trento::Event_const&)>*,std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>
                          (pfVar9,pfVar15,pfVar13,
                           (allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>
                            *)this);
      pfVar15 = std::
                __relocate_a_1<std::function<void(int,double,int,trento::Event_const&)>*,std::function<void(int,double,int,trento::Event_const&)>*,std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>
                          (pfVar15,pfVar3,pfVar14 + 1,
                           (allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>
                            *)this);
      if (pfVar9 != (function<void_(int,_double,_int,_const_trento::Event_&)> *)0x0) {
        operator_delete(pfVar9);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar13;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar15;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar13 + sVar12;
    }
    else {
      std::
      allocator_traits<std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>::
      construct<std::function<void(int,double,int,trento::Event_const&)>,trento::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)pfVar15,
                 (function<void_(int,_double,_int,_const_trento::Event_&)> *)&local_80,__args);
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

Output::Output(const VarMap& var_map) {
  // Determine the required width (padding) of the event number.  For example if
  // there are 10 events, the numbers are 0-9 and so no padding is necessary.
  // However given 11 events, the numbers are 00-10 with padded 00, 01, ...
  auto nevents = var_map["number-events"].as<int>();
  auto width = static_cast<int>(std::ceil(std::log10(nevents)));

  // Write to stdout unless the quiet option was specified.
  if (!var_map["quiet"].as<bool>()) {
    writers_.emplace_back(
      [width](int num, double impact_param, int ncoll, const Event& event) {
        write_stream(std::cout, width, num, impact_param, ncoll, event);
      }
    );
  }

  // Possibly write to text or HDF5 files.
  if (var_map.count("output")) {
    const auto& output_path = var_map["output"].as<fs::path>();
    if (hdf5::filename_is_hdf5(output_path)) {
#ifdef TRENTO_HDF5
      if (fs::exists(output_path) && !fs::is_empty(output_path))
        throw std::runtime_error{"file '" + output_path.string() +
                                 "' exists, will not overwrite"};
      writers_.emplace_back(HDF5Writer{output_path});
#else
      throw std::runtime_error{"HDF5 output was not compiled"};
#endif  // TRENTO_HDF5
    } else {
      // Text files are all written into a single directory.  Require the
      // directory to be initially empty to avoid accidental overwriting and/or
      // spewing files into an already-used location.  If the directory does not
      // exist, create it.
      if (fs::exists(output_path)) {
        if (!fs::is_empty(output_path)) {
          throw std::runtime_error{"output directory '" + output_path.string() +
                                   "' must be empty"};
        }
      } else {
        fs::create_directories(output_path);
      }
      auto header = !var_map["no-header"].as<bool>();
      writers_.emplace_back(
        [output_path, width, header](int num, double impact_param,
          int ncoll, const Event& event) {
          write_text_file(output_path, width, num,
              impact_param, ncoll, event, header);
        }
      );
    }
  }
}